

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbcursor.cpp
# Opt level: O2

xcb_cursor_t __thiscall QXcbCursor::createNonStandardCursor(QXcbCursor *this,int cshape)

{
  xcb_window_t xVar1;
  xcb_connection_t *pxVar2;
  QXcbScreen *screen;
  char cVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  xcb_cursor_t xVar6;
  xcb_pixmap_t xVar7;
  xcb_pixmap_t xVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff58;
  uint uVar12;
  long lVar11;
  undefined4 uVar14;
  undefined8 uVar13;
  ulong in_stack_ffffffffffffff68;
  ulong uVar15;
  undefined4 uVar17;
  undefined8 uVar16;
  ulong in_stack_ffffffffffffff70;
  ulong uVar18;
  undefined4 uVar20;
  undefined8 uVar19;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  QPixmap local_70 [24];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  uVar12 = (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar2 = (((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection;
  if (cshape == 10) {
    xVar1 = this->m_screen->m_virtualDesktop->m_screen->root;
    puVar10 = cur_blank_bits;
    puVar9 = cur_blank_bits;
    uVar18 = 0;
    uVar15 = 0;
LAB_001530ca:
    uVar4 = xcb_create_pixmap_from_bitmap_data(pxVar2,xVar1,puVar9,0x10,0x10,1,uVar15,uVar18,0);
    uVar21 = 0;
    uVar20 = 0;
    uVar17 = 0;
    uVar14 = 0;
    uVar5 = xcb_create_pixmap_from_bitmap_data
                      (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,puVar10,0x10,0x10,1,0
                       ,0,0);
    uVar23 = 0;
    xVar6 = xcb_generate_id(pxVar2);
    uVar22 = 8;
LAB_00153118:
    uVar15 = CONCAT44(uVar23,uVar22);
    uVar18 = CONCAT44(uVar21,uVar22);
LAB_0015320d:
    lVar11 = (ulong)uVar12 << 0x20;
    uVar19 = CONCAT44(uVar20,0xffff);
    uVar16 = CONCAT44(uVar17,0xffff);
    uVar13 = CONCAT44(uVar14,0xffff);
  }
  else {
    if (cshape - 5U < 4) {
      uVar4 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,
                         cursor_bits16[cshape * 2 - 10],0x10,0x10,1,0,0,0);
      uVar22 = 0;
      uVar20 = 0;
      uVar17 = 0;
      uVar14 = 0;
      uVar5 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,
                         cursor_bits16[cshape * 2 - 9],0x10,0x10,1,0,0,0);
      uVar21 = 0;
      xVar6 = xcb_generate_id(pxVar2);
      uVar15 = CONCAT44(uVar21,8);
      uVar18 = CONCAT44(uVar22,8);
      goto LAB_0015320d;
    }
    if (0x10 < (uint)cshape) {
LAB_001533bf:
      if (1 < cshape - 0x11U) {
        xVar6 = 0;
        if (cshape - 0x13U < 3) {
          local_48 = 0xaaaaaaaaaaaaaaaa;
          local_58 = 0xaaaaaaaaaaaaaaaa;
          uStack_50 = 0xaaaaaaaaaaaaaaaa;
          QGuiApplicationPrivate::getPixmapCursor((CursorShape)local_70);
          QPixmap::toImage();
          QPixmap::~QPixmap(local_70);
          cVar3 = QImage::isNull();
          xVar6 = 0;
          if (cVar3 == '\0') {
            xVar7 = qt_xcb_XPixmapFromBitmap(this->m_screen,(QImage *)&local_58);
            screen = this->m_screen;
            QImage::createAlphaMask((QImage *)local_70,(QImage *)&local_58,0);
            xVar8 = qt_xcb_XPixmapFromBitmap(screen,(QImage *)local_70);
            QImage::~QImage((QImage *)local_70);
            xVar6 = xcb_generate_id(pxVar2);
            xcb_create_cursor(pxVar2,xVar6,xVar7,xVar8,0,0,0,0xffff,0xffff,0xffff,8,8);
            xcb_free_pixmap(pxVar2,xVar7);
            xcb_free_pixmap(pxVar2,xVar8);
          }
          QImage::~QImage((QImage *)&local_58);
        }
        goto LAB_0015321f;
      }
      xVar1 = this->m_screen->m_virtualDesktop->m_screen->root;
      uVar15 = in_stack_ffffffffffffff68 & 0xffffffff00000000;
      uVar18 = in_stack_ffffffffffffff70 & 0xffffffff00000000;
      puVar9 = "";
      if (cshape == 0x11) {
        puVar9 = openhand_bits;
      }
      puVar10 = "";
      if (cshape == 0x11) {
        puVar10 = openhandm_bits;
      }
      goto LAB_001530ca;
    }
    if ((0x19800U >> (cshape & 0x1fU) & 1) == 0) {
      if (cshape != 0xe) goto LAB_001533bf;
      uVar4 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,"",0x14,0x14,1,0,0,
                         0);
      uVar21 = 0;
      uVar20 = 0;
      uVar17 = 0;
      uVar14 = 0;
      uVar5 = xcb_create_pixmap_from_bitmap_data
                        (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,forbiddenm_bits,
                         0x14,0x14,1,0,0,0);
      uVar23 = 0;
      xVar6 = xcb_generate_id(pxVar2);
      uVar22 = 10;
      goto LAB_00153118;
    }
    uVar4 = xcb_create_pixmap_from_bitmap_data
                      (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,
                       cursor_bits32[cshape * 2 - 0x16],0x20,0x20,1,0,0,0);
    uVar5 = xcb_create_pixmap_from_bitmap_data
                      (pxVar2,this->m_screen->m_virtualDesktop->m_screen->root,
                       cursor_bits32[cshape * 2 - 0x15],0x20,0x20,1,0,0,0);
    xVar6 = xcb_generate_id(pxVar2);
    uVar12 = (uint)((cshape & 0x1dU) != 0xd) << 4;
    if (cshape == 0x10) {
      uVar12 = 0;
    }
    uVar18 = (ulong)uVar12;
    uVar19 = 0xffff;
    uVar16 = 0xffff;
    uVar13 = 0xffff;
    lVar11 = 0;
    uVar15 = uVar18;
  }
  xcb_create_cursor(pxVar2,xVar6,uVar4,uVar5,0,0,lVar11,uVar13,uVar16,uVar19,uVar18,uVar15);
LAB_0015321f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return xVar6;
}

Assistant:

xcb_cursor_t QXcbCursor::createNonStandardCursor(int cshape)
{
    xcb_cursor_t cursor = 0;
    xcb_connection_t *conn = xcb_connection();

    if (cshape == Qt::BlankCursor) {
        xcb_pixmap_t cp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        xcb_pixmap_t mp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, cp, mp, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape >= Qt::SizeVerCursor && cshape < Qt::SizeAllCursor) {
        int i = (cshape - Qt::SizeVerCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits16[i]),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits16[i + 1]),
                                                              16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if ((cshape >= Qt::SplitVCursor && cshape <= Qt::SplitHCursor)
               || cshape == Qt::WhatsThisCursor || cshape == Qt::BusyCursor) {
        int i = (cshape - Qt::SplitVCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits32[i]),
                                                             32, 32, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits32[i + 1]),
                                                              32, 32, 1, 0, 0, nullptr);
        int hs = (cshape == Qt::PointingHandCursor || cshape == Qt::WhatsThisCursor
                  || cshape == Qt::BusyCursor) ? 0 : 16;
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, hs, hs);
    } else if (cshape == Qt::ForbiddenCursor) {
        int i = (cshape - Qt::ForbiddenCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits20[i]),
                                                             20, 20, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits20[i + 1]),
                                                              20, 20, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 10, 10);
    } else if (cshape == Qt::OpenHandCursor || cshape == Qt::ClosedHandCursor) {
        bool open = cshape == Qt::OpenHandCursor;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhand_bits : closedhand_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhandm_bits : closedhandm_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape == Qt::DragCopyCursor || cshape == Qt::DragMoveCursor
               || cshape == Qt::DragLinkCursor) {
        QImage image = QGuiApplicationPrivate::instance()->getPixmapCursor(static_cast<Qt::CursorShape>(cshape)).toImage();
        if (!image.isNull()) {
            xcb_pixmap_t pm = qt_xcb_XPixmapFromBitmap(m_screen, image);
            xcb_pixmap_t pmm = qt_xcb_XPixmapFromBitmap(m_screen, image.createAlphaMask());
            cursor = xcb_generate_id(conn);
            xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
            xcb_free_pixmap(conn, pm);
            xcb_free_pixmap(conn, pmm);
        }
    }

    return cursor;
}